

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classifier.hpp
# Opt level: O0

int __thiscall
sp::template_classifier::compare_(template_classifier *this,Mat *tem,Mat *true_sample)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  undefined1 in_DL;
  undefined7 in_register_00000011;
  Mat *in_RSI;
  long in_RDI;
  bool r;
  bool l;
  uint32_t j;
  uchar *rhs;
  uchar *lhs;
  uint32_t i;
  int same_cnt;
  uint32_t sum_pixel;
  uint32_t iter_cols;
  uint32_t iter_rows;
  uint local_44;
  uchar *local_40;
  uchar *local_38;
  uint local_2c;
  int local_28;
  uint local_20;
  uint local_1c;
  
  local_1c = *(uint *)(in_RDI + 0x10);
  local_20 = *(uint *)(in_RDI + 0xc);
  uVar2 = local_1c * local_20;
  bVar1 = cv::Mat::isContinuous(in_RSI);
  if ((bVar1) && (bVar1 = cv::Mat::isContinuous((Mat *)CONCAT71(in_register_00000011,in_DL)), bVar1)
     ) {
    local_1c = 1;
    local_20 = uVar2;
  }
  local_28 = 0;
  for (local_2c = 0; local_2c < local_1c; local_2c = local_2c + 1) {
    local_38 = cv::Mat::ptr<unsigned_char>(in_RSI,local_2c);
    local_40 = cv::Mat::ptr<unsigned_char>((Mat *)CONCAT71(in_register_00000011,in_DL),local_2c);
    for (local_44 = 0; local_44 < local_20; local_44 = local_44 + 1) {
      if ((*local_38 != '\0') || (*local_40 != '\0')) {
        iVar3 = -1;
        if (*local_38 != '\0' && *local_40 != '\0') {
          iVar3 = 3;
        }
        local_28 = iVar3 + local_28;
      }
      local_40 = local_40 + 1;
      local_38 = local_38 + 1;
    }
  }
  return local_28;
}

Assistant:

inline int        compare_(cv::Mat& tem, cv::Mat& true_sample)
	{
		uint32_t iter_rows = fixed_sz.height;
	    uint32_t iter_cols = fixed_sz.width;
	    auto sum_pixel = iter_rows * iter_cols;
		if(tem.isContinuous() && true_sample.isContinuous())
	   	{
			iter_cols = sum_pixel;
			iter_rows = 1;
		}
		int same_cnt = 0;
		for (uint32_t i = 0; i < iter_rows; ++i)
		{
			const uchar* lhs = tem.ptr<uchar>(i);
			const uchar* rhs = true_sample.ptr<uchar>(i);
			for (uint32_t j = 0; j < iter_cols; ++j)
			{
		    	bool l = *lhs++, r = *rhs++;
		    	if(!l && !r)
		        	continue;
		    	same_cnt += (l && r) ? 3 : -1;
			}
		}
	    return same_cnt;
	}